

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O1

Col_Word Col_ConcatRopesNV(size_t number,...)

{
  long lVar1;
  char in_AL;
  Col_Word CVar2;
  uint uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t sVar4;
  undefined8 in_RSI;
  Col_Word *ropes;
  undefined8 in_R8;
  Col_Word *pCVar5;
  ulong uVar6;
  Col_Word *pCVar7;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_e0;
  Col_Word local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  va_list args;
  
  local_d8[1] = in_RSI;
  local_d8[2] = in_RDX;
  local_d8[3] = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (number == 0) {
    CVar2 = 0;
    uStack_e0 = 0x10bc49;
    Col_Error(COL_VALUECHECK,ColibriDomain,0);
  }
  else {
    lVar1 = -(number * 8 + 0xf & 0xfffffffffffffff0);
    ropes = (Col_Word *)((long)local_d8 + lVar1);
    args[0].overflow_arg_area = local_d8;
    pCVar5 = (Col_Word *)&stack0x00000008;
    args[0]._0_8_ = pCVar5;
    local_28 = 0x3000000008;
    uVar3 = 8;
    sVar4 = 0;
    do {
      if (uVar3 < 0x29) {
        uVar6 = (ulong)uVar3;
        uVar3 = uVar3 + 8;
        local_28 = CONCAT44(local_28._4_4_,uVar3);
        pCVar7 = (Col_Word *)((long)local_d8 + uVar6);
      }
      else {
        args[0]._0_8_ = pCVar5 + 1;
        pCVar7 = pCVar5;
        pCVar5 = pCVar5 + 1;
      }
      ropes[sVar4] = *pCVar7;
      sVar4 = sVar4 + 1;
    } while (number != sVar4);
    *(undefined8 *)((long)local_d8 + lVar1 + -8) = 0x10bc2d;
    CVar2 = Col_ConcatRopesA(number,ropes);
  }
  return CVar2;
}

Assistant:

Col_Word
Col_ConcatRopesNV(
    size_t number,  /*!< Number of arguments following. */
    ...)            /*!< Ropes to concatenate in order. */
{
    size_t i;
    va_list args;
    Col_Word *ropes;

    /*
     * Check preconditions.
     */

    /*! @valuecheck{COL_ERROR_GENERIC,number == 0} */
    VALUECHECK(number != 0, COL_ERROR_GENERIC) return WORD_NIL;

    /*
     * Convert vararg list to array. Use alloca since a vararg list is
     * typically small.
     */

    ropes = (Col_Word *) alloca(number*sizeof(Col_Word));
    va_start(args, number);
    for (i=0; i < number; i++) {
        ropes[i] = va_arg(args, Col_Word);
    }
    va_end(args);
    return Col_ConcatRopesA(number, ropes);
}